

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

bool __thiscall
Memory::HeapBlockMap32::SetHeapBlock
          (HeapBlockMap32 *this,void *address,uint pageCount,HeapBlock *heapBlock,
          HeapBlockType blockType,byte bucketIndex)

{
  bool bVar1;
  
  bVar1 = EnsureHeapBlock(this,address,pageCount);
  if (bVar1) {
    SetHeapBlockNoCheck(this,address,pageCount,heapBlock,blockType,bucketIndex);
  }
  return bVar1;
}

Assistant:

bool
HeapBlockMap32::SetHeapBlock(void * address, uint pageCount, HeapBlock * heapBlock, HeapBlock::HeapBlockType blockType, byte bucketIndex)
{
    // First, make sure we have all the necessary L2MapChunks we'll need.
    // This ensures that in case of failure, the concurrent thread won't see an inconsistent state.
    if (!EnsureHeapBlock(address, pageCount))
    {
        return false;
    }

    // Now, do the actual set, which cannot fail.
    SetHeapBlockNoCheck(address, pageCount, heapBlock, blockType, bucketIndex);
    return true;
}